

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Robot.cpp
# Opt level: O0

void __thiscall Robot::calcWorldVelocity(Robot *this)

{
  double dVar1;
  double dVar2;
  reference pvVar3;
  reference this_00;
  int local_60;
  int local_5c;
  int j;
  int i;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  b;
  allocator<double> local_29;
  undefined1 local_28 [8];
  vector<double,_std::allocator<double>_> ans;
  Robot *this_local;
  
  ans.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  std::allocator<double>::allocator(&local_29);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_28,3,&local_29);
  std::allocator<double>::~allocator(&local_29);
  bMatrix((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           *)&j,(this->robotInfo).theta);
  for (local_5c = 0; local_5c < 3; local_5c = local_5c + 1) {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_28,(long)local_5c);
    *pvVar3 = 0.0;
    for (local_60 = 0; local_60 < 3; local_60 = local_60 + 1) {
      this_00 = std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              *)&j,(long)local_5c);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](this_00,(long)local_60);
      dVar1 = *pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&(this->robotInfo).selfCorVelocity,(long)local_60);
      dVar2 = *pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_28,(long)local_5c);
      *pvVar3 = dVar1 * dVar2 + *pvVar3;
    }
  }
  std::vector<double,_std::allocator<double>_>::operator=
            (&(this->robotInfo).robotVelocity,(vector<double,_std::allocator<double>_> *)local_28);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)&j);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_28);
  return;
}

Assistant:

void Robot::calcWorldVelocity() {
    std::vector<double> ans(3);
    std::vector<std::vector<double> > b = bMatrix(this->robotInfo.theta);
    for (int i = 0; i < 3; i++) {
        ans[i] = 0;
        for (int j = 0; j < 3; j++) {
            ans[i] += b[i][j] * this->robotInfo.selfCorVelocity[j];
        }
    }
    this->robotInfo.robotVelocity = ans;
}